

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O0

EnumClass __thiscall
phmap::priv::hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
          (Generator<phmap::priv::hash_internal::EnumClass,_void> *this)

{
  mt19937_64 *__urng;
  EnumClass EVar1;
  EnumClass variate;
  uniform_int_distribution<unsigned_long> dist;
  Generator<phmap::priv::hash_internal::EnumClass,_void> *this_local;
  
  dist._M_param._M_b = (unsigned_long)this;
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&variate);
  do {
    do {
      __urng = GetSharedRng();
      EVar1 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&variate,__urng);
    } while (EVar1 == kEmpty);
  } while (EVar1 == kDeleted);
  return EVar1;
}

Assistant:

EnumClass operator()() const {
        std::uniform_int_distribution<
            typename std::underlying_type<EnumClass>::type> dist;
        while (true) {
            EnumClass variate = static_cast<EnumClass>(dist(*GetSharedRng()));
            if (variate != EnumClass::kEmpty && variate != EnumClass::kDeleted)
                return static_cast<EnumClass>(variate);
        }
    }